

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::PipelineRegressor::ByteSizeLong(PipelineRegressor *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if (this->pipeline_ == (Pipeline *)0x0 ||
      this == (PipelineRegressor *)&_PipelineRegressor_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = Pipeline::ByteSizeLong(this->pipeline_);
    uVar3 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t PipelineRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PipelineRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.Pipeline pipeline = 1;
  if (this->has_pipeline()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->pipeline_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}